

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Sem.cpp
# Opt level: O0

__pid_t __thiscall axl::sys::psx::NamedSem::wait(NamedSem *this,void *__stat_loc)

{
  bool bVar1;
  undefined7 extraout_var;
  int iVar2;
  timespec timespec;
  int result;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_20 [4];
  uint_t in_stack_ffffffffffffffe4;
  
  iVar2 = (int)__stat_loc;
  if (iVar2 == -1) {
    sem_wait((sem_t *)(this->
                      super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>).
                      m_h);
  }
  else if (iVar2 == 0) {
    sem_trywait((sem_t *)(this->
                         super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                         ).m_h);
  }
  else {
    memset(local_20,0,0x10);
    getAbsTimespecFromTimeout
              (in_stack_ffffffffffffffe4,(timespec *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    sem_timedwait((sem_t *)(this->
                           super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                           ).m_h,(timespec *)local_20);
  }
  bVar1 = err::complete(0);
  return (__pid_t)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool
NamedSem::wait(uint_t timeout) {
	int result;

	switch (timeout) {
	case 0:
		result = ::sem_trywait(m_h);
		break;

	case -1:
		result = ::sem_wait(m_h);
		break;

	default:
		timespec timespec = { 0 };
		sys::getAbsTimespecFromTimeout(timeout, &timespec);
		result = ::sem_timedwait(m_h, &timespec);
	}

	return err::complete(result == 0);
}